

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * __thiscall
chaiscript::AST_Node::to_string(string *__return_storage_ptr__,AST_Node *this,string *t_prepend)

{
  char *__s;
  pointer psVar1;
  AST_Node *this_00;
  pointer pcVar2;
  string *psVar3;
  ostream *poVar4;
  size_t sVar5;
  pointer psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream oss;
  string local_1f0;
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(t_prepend->_M_dataplus)._M_p,t_prepend->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  __s = (&PTR_anon_var_dwarf_e3850_003197d0)[this->identifier];
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->text)._M_dataplus._M_p,(this->text)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->location).start.line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->location).start.column);
  local_1f0._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1f0,1);
  psVar6 = (this->children).
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->children).
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1b0 = __return_storage_ptr__;
  if (psVar6 != psVar1) {
    do {
      this_00 = (psVar6->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      pcVar2 = (t_prepend->_M_dataplus)._M_p;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar2,pcVar2 + t_prepend->_M_string_length);
      std::__cxx11::string::append((char *)&local_1d0);
      to_string(&local_1f0,this_00,&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 (char *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_)
                 ,local_1f0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_) !=
          &local_1f0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f0._M_dataplus._M_p._1_7_,local_1f0._M_dataplus._M_p._0_1_),
                        local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
  }
  psVar3 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string to_string(const std::string &t_prepend = "") const {
        std::ostringstream oss;

        oss << t_prepend << "(" << ast_node_type_to_string(this->identifier) << ") "
            << this->text << " : " << this->location.start.line << ", " << this->location.start.column << '\n';

        for (auto & elem : this->children) {
          oss << elem->to_string(t_prepend + "  ");
        }
        return oss.str();
      }